

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void group_gain(CHAR_DATA *ch,CHAR_DATA *victim)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  CHAR_DATA *in_RSI;
  CHAR_DATA *in_RDI;
  bool ispk;
  int group_levels;
  int members;
  int xp;
  CHAR_DATA *lch;
  CHAR_DATA *gch;
  char buf [4608];
  CHAR_DATA *in_stack_ffffffffffffed88;
  CHAR_DATA *__s;
  CHAR_DATA *in_stack_ffffffffffffed98;
  CHAR_DATA *in_stack_ffffffffffffeda0;
  CHAR_DATA *in_stack_ffffffffffffeda8;
  CHAR_DATA *local_1240;
  int glevel;
  uint in_stack_ffffffffffffedd4;
  uint uVar5;
  CHAR_DATA *pCVar6;
  CHAR_DATA local_1218 [5];
  int in_stack_ffffffffffffffbc;
  CHAR_DATA *in_stack_ffffffffffffffc0;
  
  if (in_RSI != in_RDI) {
    bVar1 = is_npc(in_stack_ffffffffffffed88);
    glevel = 0;
    for (pCVar6 = in_RDI->in_room->people; pCVar6 != (CHAR_DATA *)0x0; pCVar6 = pCVar6->next_in_room
        ) {
      bVar2 = is_same_group(pCVar6,in_RDI);
      if (bVar2) {
        glevel = glevel + 1;
        is_npc(in_stack_ffffffffffffed88);
      }
    }
    if (glevel == 0) {
      glevel = 1;
    }
    local_1240 = in_RDI;
    if (in_RDI->leader != (CHAR_DATA *)0x0) {
      local_1240 = in_RDI->leader;
    }
    if (in_RDI->in_room != (ROOM_INDEX_DATA *)0x0) {
      for (pCVar6 = in_RDI->in_room->people; pCVar6 != (CHAR_DATA *)0x0;
          pCVar6 = pCVar6->next_in_room) {
        bVar2 = is_same_group(pCVar6,in_RDI);
        if (bVar2) {
          if ((int)pCVar6->level - (int)local_1240->level < 9) {
            if ((int)pCVar6->level - (int)local_1240->level < -8) {
              send_to_char((char *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
            }
            else {
              if (bVar1) {
                in_stack_ffffffffffffedd4 =
                     xp_compute(pCVar6,local_1240,in_stack_ffffffffffffedd4,glevel);
              }
              else {
                in_stack_ffffffffffffedd4 =
                     xp_compute_pk(in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0,
                                   (int)((ulong)in_stack_ffffffffffffed98 >> 0x20));
              }
              if ((int)in_stack_ffffffffffffedd4 < 0) {
                in_stack_ffffffffffffedd4 = 0;
              }
              if (pCVar6->level < 0x33) {
                if ((int)in_stack_ffffffffffffedd4 < 1) {
                  in_stack_ffffffffffffed98 = local_1218;
                  in_stack_ffffffffffffeda0 =
                       (CHAR_DATA *)
                       get_char_color(in_stack_ffffffffffffeda8,(char *)in_stack_ffffffffffffeda0);
                  pcVar3 = END_COLOR(in_stack_ffffffffffffed98);
                  sprintf((char *)in_stack_ffffffffffffed98,
                          "%sYou receive no experience from this victory.%s\n\r",
                          in_stack_ffffffffffffeda0,pcVar3);
                }
                else {
                  in_stack_ffffffffffffeda8 = local_1218;
                  pcVar3 = get_char_color(in_stack_ffffffffffffeda8,
                                          (char *)in_stack_ffffffffffffeda0);
                  uVar5 = in_stack_ffffffffffffedd4;
                  pcVar4 = END_COLOR(in_stack_ffffffffffffed98);
                  sprintf((char *)in_stack_ffffffffffffeda8,
                          "%sYou receive %d experience points.%s\n\r",pcVar3,
                          (ulong)in_stack_ffffffffffffedd4,pcVar4);
                  in_stack_ffffffffffffedd4 = uVar5;
                }
              }
              else {
                __s = local_1218;
                pcVar3 = get_char_color(in_stack_ffffffffffffeda8,(char *)in_stack_ffffffffffffeda0)
                ;
                pcVar4 = END_COLOR(in_stack_ffffffffffffed98);
                sprintf((char *)__s,
                        "%sYou have already reached the pinnacle of your learning.%s\n\r",pcVar3,
                        pcVar4);
              }
              send_to_char((char *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
              gain_exp(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
            }
          }
          else {
            send_to_char((char *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void group_gain(CHAR_DATA *ch, CHAR_DATA *victim)
{
	char buf[MAX_STRING_LENGTH];
	CHAR_DATA *gch;
	CHAR_DATA *lch;
	int xp;
	int members;
	int group_levels;
	bool ispk = false;

	/*
	 * Monsters don't get kill xp's or alignment changes.
	 * P-killing doesn't help either.
	 * Dying of mortal wounds or poison doesn't give xp to anyone!
	 */

	if (victim == ch)
		return;

	if (!is_npc(victim))
		ispk = true;

	members = 0;
	group_levels = 0;

	for (gch = ch->in_room->people; gch != nullptr; gch = gch->next_in_room)
	{
		if (is_same_group(gch, ch))
		{
			// if(!is_npc(gch))
			members++;
			group_levels += (is_npc(gch) && gch->master) ? gch->master->level : gch->level;
			// note: the preceding code skews the group average a bit in favor of the group leader if there's npcs in
			// the group but i don't really care
		}
	}

	if (members == 0)
		members = 1;

	lch = (ch->leader != nullptr) ? ch->leader : ch;

	if (ch->in_room == nullptr)
		return;

	for (gch = ch->in_room->people; gch != nullptr; gch = gch->next_in_room)
	{
		if (!is_same_group(gch, ch)) // || is_npc(gch))
			continue;

		if (gch->level - lch->level > 8)
		{
			send_to_char("You are too high for this group.\n\r", gch);
			continue;
		}

		if (gch->level - lch->level < -8)
		{
			send_to_char("You are too low for this group.\n\r", gch);
			continue;
		}

		if (!ispk)
			xp = xp_compute(gch, victim, members, group_levels);
		else
			xp = xp_compute_pk(gch, victim, members);

		if (xp < 0)
			xp = 0;

		if (gch->level < 51)
		{
			if (xp > 0)
				sprintf(buf, "%sYou receive %d experience points.%s\n\r", get_char_color(gch, "white"), xp, END_COLOR(gch));
			else
				sprintf(buf, "%sYou receive no experience from this victory.%s\n\r", get_char_color(gch, "white"), END_COLOR(gch));
		}
		else
		{
			sprintf(buf, "%sYou have already reached the pinnacle of your learning.%s\n\r", get_char_color(gch, "white"), END_COLOR(gch));
		}

		send_to_char(buf, gch);
		gain_exp(gch, xp);
	}
}